

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  pointer piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int32_t iVar8;
  DenseMatrix *pDVar9;
  int64_t m;
  size_type __n;
  pointer piVar10;
  ulong uVar11;
  int *piVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  DenseMatrix *pDVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_asd5510[P]fastText_chinese_word2vec_optimization_src_fasttext_cc:348:37)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_asd5510[P]fastText_chinese_word2vec_optimization_src_fasttext_cc:348:37)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_asd5510[P]fastText_chinese_word2vec_optimization_src_fasttext_cc:348:37)>
  __comp_01;
  Vector norms;
  allocator_type local_59;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Vector local_50;
  value_type_conflict1 local_34;
  
  peVar3 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar14 = (DenseMatrix *)0x0;
  }
  else {
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar9 = (DenseMatrix *)__dynamic_cast(peVar3,&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
    pDVar14 = (DenseMatrix *)0x0;
    if (pDVar9 != (DenseMatrix *)0x0) {
      p_Var13 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      pDVar14 = pDVar9;
      if (p_Var13 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      }
    }
  }
  local_58 = p_Var13;
  m = Matrix::size(&pDVar14->super_Matrix,0);
  Vector::Vector(&local_50,m);
  DenseMatrix::l2NormRow(pDVar14,&local_50);
  __n = Matrix::size(&pDVar14->super_Matrix,0);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_34,&local_59);
  piVar10 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar10 != piVar4) {
    auVar15 = vpbroadcastq_avx512vl();
    auVar17 = vpsrlq_avx2(auVar15,2);
    auVar15 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    uVar11 = 0;
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar18._8_4_ = 8;
    auVar18._0_8_ = 0x800000008;
    auVar18._12_4_ = 8;
    auVar18._16_4_ = 8;
    auVar18._20_4_ = 8;
    auVar18._24_4_ = 8;
    auVar18._28_4_ = 8;
    do {
      auVar16 = vpbroadcastq_avx512vl();
      auVar7 = vpor_avx2(auVar16,auVar5);
      auVar16 = vpor_avx2(auVar16,auVar6);
      vpcmpuq_avx512vl(auVar16,auVar17,2);
      vpcmpuq_avx512vl(auVar7,auVar17,2);
      auVar7 = vmovdqu32_avx512vl(auVar15);
      *(undefined1 (*) [32])(piVar10 + uVar11) = auVar7;
      uVar11 = uVar11 + 8;
      auVar15 = vpaddd_avx2(auVar15,auVar18);
    } while ((((ulong)((long)piVar4 + (-4 - (long)piVar10)) >> 2) + 8 & 0xfffffffffffffff8) !=
             uVar11);
  }
  iVar8 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(string *)&Dictionary::EOS_abi_cxx11_);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.eosid = iVar8;
    __comp._M_comp.norms = &local_50;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 2) *
                            2) ^ 0x7e,__comp);
    if (0x40 < (long)__last._M_current - (long)__first._M_current) {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar8;
      __comp_00._M_comp.norms = &local_50;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
LAB_0012b747:
      if (__last_00._M_current != __last._M_current) {
        iVar1 = *__last_00._M_current;
        piVar12 = __last_00._M_current;
        do {
          iVar2 = piVar12[-1];
          if (iVar2 == iVar8 || iVar1 == iVar8) {
            if ((iVar1 != iVar8) || (iVar2 == iVar8)) goto LAB_0012b795;
          }
          else if (local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar1] <=
                   local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2]) goto LAB_0012b795;
          *piVar12 = iVar2;
          piVar12 = piVar12 + -1;
        } while( true );
      }
      goto LAB_0012b7b0;
    }
    __comp_01._M_comp.eosid = iVar8;
    __comp_01._M_comp.norms = &local_50;
    __comp_01._M_comp._12_4_ = 0;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,__comp_01);
  }
LAB_0012b7b0:
  p_Var13 = local_58;
  piVar10 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start + cutoff;
  if (piVar10 !=
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar10;
  }
  if (local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
  }
  return __return_storage_ptr__;
LAB_0012b795:
  *piVar12 = iVar1;
  __last_00._M_current = __last_00._M_current + 1;
  goto LAB_0012b747;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  Vector norms(input->size(0));
  input->l2NormRow(norms);
  std::vector<int32_t> idx(input->size(0), 0);
  std::iota(idx.begin(), idx.end(), 0);
  auto eosid = dict_->getId(Dictionary::EOS);
  std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
    if (i1 == eosid && i2 == eosid) { // satisfy strict weak ordering
      return false;
    }
    return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
  });
  idx.erase(idx.begin() + cutoff, idx.end());
  return idx;
}